

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

int __thiscall QVariant::toInt(QVariant *this,bool *ok)

{
  int iVar1;
  
  iVar1 = qNumVariantToHelper<int>(&this->d,ok);
  return iVar1;
}

Assistant:

int QVariant::toInt(bool *ok) const
{
    return qNumVariantToHelper<int>(d, ok);
}